

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void printOptionExportValues(TidyDoc tdoc,TidyOption topt,OptionDesc *d)

{
  TidyOptionId optId_00;
  TidyConfigCategory TVar1;
  ctmbstr ptVar2;
  size_t sVar3;
  TidyIterator local_78;
  TidyIterator itAttr;
  TidyIterator pos;
  TidyBuffer buf2;
  TidyBuffer buf1;
  TidyOptionId optId;
  OptionDesc *d_local;
  TidyOption topt_local;
  TidyDoc tdoc_local;
  
  optId_00 = tidyOptGetId(topt);
  TVar1 = tidyOptGetCategory(topt);
  if (TVar1 != TidyInternalCategory) {
    if ((((optId_00 == TidyBlockTags) || (optId_00 == TidyEmptyTags)) ||
        (optId_00 == TidyInlineTags)) || (optId_00 == TidyPreTags)) {
      itAttr = tidyOptGetDeclTagList(tdoc);
      if (itAttr != (TidyIterator)0x0) {
        tidyBufInit((TidyBuffer *)&buf2.next);
        tidyBufInit((TidyBuffer *)&pos);
        while (itAttr != (TidyIterator)0x0) {
          ptVar2 = tidyOptGetNextDeclTag(tdoc,optId_00,&itAttr);
          d->def = ptVar2;
          if (d->def != (ctmbstr)0x0) {
            if ((int)buf1.bp != 0) {
              tidyBufAppend((TidyBuffer *)&buf2.next," ",1);
            }
            ptVar2 = d->def;
            sVar3 = strlen(d->def);
            tidyBufAppend((TidyBuffer *)&buf2.next,ptVar2,(uint)sVar3);
          }
        }
        invertBuffer((TidyBuffer *)&buf2.next,(TidyBuffer *)&pos);
        tidyBufAppend((TidyBuffer *)&pos,"",1);
        printf("%s: %s\n",d->name,buf2.allocator);
        d->name = "";
        d->type = "";
        d->def = (ctmbstr)0x0;
        tidyBufFree((TidyBuffer *)&buf2.next);
        tidyBufFree((TidyBuffer *)&pos);
      }
    }
    else if (((optId_00 == TidyPriorityAttributes) &&
             (local_78 = tidyOptGetPriorityAttrList(tdoc), local_78 != (TidyIterator)0x0)) &&
            (local_78 != (TidyIterator)0xffffffffffffffff)) {
      tidyBufInit((TidyBuffer *)&buf2.next);
      while (local_78 != (TidyIterator)0x0) {
        ptVar2 = tidyOptGetNextPriorityAttr(tdoc,&local_78);
        d->def = ptVar2;
        if (d->def != (ctmbstr)0x0) {
          if ((int)buf1.bp != 0) {
            tidyBufAppend((TidyBuffer *)&buf2.next," ",1);
          }
          ptVar2 = d->def;
          sVar3 = strlen(d->def);
          tidyBufAppend((TidyBuffer *)&buf2.next,ptVar2,(uint)sVar3);
        }
      }
      tidyBufAppend((TidyBuffer *)&buf2.next,"",1);
      printf("%s: %s\n",d->name,buf1.allocator);
      d->name = "";
      d->type = "";
      d->def = (ctmbstr)0x0;
      tidyBufFree((TidyBuffer *)&buf2.next);
    }
    if (((*d->name != '\0') || (*d->type != '\0')) ||
       ((d->def != (ctmbstr)0x0 && (*d->def != '\0')))) {
      if (d->def == (ctmbstr)0x0) {
        d->def = "";
      }
      printf("%s: %s\n",d->name,d->def);
    }
  }
  return;
}

Assistant:

static void printOptionExportValues(TidyDoc ARG_UNUSED(tdoc),  /**< The Tidy document. */
                                    TidyOption topt,           /**< The option for which to show values. */
                                    OptionDesc *d              /**< The OptionDesc array. */
                                    )
{
    TidyOptionId optId = tidyOptGetId( topt );
    TidyBuffer buf1, buf2;

    if ( tidyOptGetCategory(topt) == TidyInternalCategory )
        return;

    switch ( optId )
    {
        case TidyInlineTags:
        case TidyBlockTags:
        case TidyEmptyTags:
        case TidyPreTags:
        {
            TidyIterator pos = tidyOptGetDeclTagList( tdoc );
            if ( pos )  /* Is #697 - one or more values */
            {
                tidyBufInit(&buf1);
                tidyBufInit(&buf2);
                while (pos)
                {
                    d->def = tidyOptGetNextDeclTag(tdoc, optId, &pos);
                    if (d->def)
                    {
                        if (buf1.size)
                            tidyBufAppend(&buf1, " ", 1);
                        tidyBufAppend(&buf1, (void *)d->def, strlen(d->def));
                    }
                }
                invertBuffer(&buf1, &buf2); /* Is #697 - specialised service to invert words */
                tidyBufAppend(&buf2, (void *)"\0", 1); /* is this really required? */
                printf("%s: %s\n", d->name, buf2.bp);
                d->name = "";
                d->type = "";
                d->def = 0;
                tidyBufFree(&buf1);
                tidyBufFree(&buf2);
            }
        }
            break;
        case TidyPriorityAttributes: /* Is #697 - This case seems missing */
        {
            TidyIterator itAttr = tidyOptGetPriorityAttrList(tdoc);
            if (itAttr && (itAttr != (TidyIterator)-1))
            {
                tidyBufInit(&buf1);
                while (itAttr)
                {
                    d->def = tidyOptGetNextPriorityAttr(tdoc, &itAttr);
                    if (d->def)
                    {
                        if (buf1.size)
                            tidyBufAppend(&buf1, " ", 1);
                        tidyBufAppend(&buf1, (void *)d->def, strlen(d->def));
                    }
                }
                tidyBufAppend(&buf1, (void *)"\0", 1); /* is this really required? */
                printf("%s: %s\n", d->name, buf1.bp);
                d->name = "";
                d->type = "";
                d->def = 0;
                tidyBufFree(&buf1);
            }
        }
        break;
        default:
            break;
    }

    /* fix for http://tidy.sf.net/bug/873921 */
    if ( *d->name || *d->type || (d->def && *d->def) )
    {
        if ( ! d->def )
            d->def = "";
        printf( "%s: %s\n", d->name, d->def );
    }
}